

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_astring.c
# Opt level: O3

void test_AString_appendAString_success_zeroSizeSrcArray_fn(int _i)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  char *expr;
  char *pcVar5;
  char **ppcVar6;
  char **ppcVar7;
  char *pcVar8;
  char *pcVar9;
  char *pcStack_b0;
  char *pcStack_a8;
  char *pcStack_a0;
  char *local_98;
  char *local_90;
  char *local_88;
  undefined8 uStack_80;
  AString srcString;
  AString destString;
  
  destString.reallocator = private_ACUtilsTest_AString_realloc;
  destString.deallocator = private_ACUtilsTest_AString_free;
  destString.size = 5;
  destString.capacity = 8;
  private_ACUtilsTest_AString_reallocFail = 0;
  uStack_80 = 0x12bf9a;
  destString.buffer = (char *)private_ACUtilsTest_AString_realloc((void *)0x0,9);
  private_ACUtilsTest_AString_reallocCount = 0;
  private_ACUtilsTest_AString_freeCount = 0;
  builtin_strncpy(destString.buffer,"01234",6);
  srcString.reallocator = private_ACUtilsTest_AString_realloc;
  srcString.deallocator = private_ACUtilsTest_AString_free;
  srcString.size = 0;
  srcString.capacity = 8;
  private_ACUtilsTest_AString_reallocFail = 0;
  uStack_80 = 0x12bfe1;
  srcString.buffer = (char *)private_ACUtilsTest_AString_realloc((void *)0x0,9);
  private_ACUtilsTest_AString_reallocCount = 0;
  private_ACUtilsTest_AString_freeCount = 0;
  *srcString.buffer = '\0';
  private_ACUtilsTest_AString_reallocFail = 0;
  uStack_80 = 0x12c008;
  bVar1 = AString_appendAString(&destString,&srcString);
  if (bVar1 == false) {
    uStack_80 = 0x12c197;
    _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x42c,"Assertion \'AString_appendAString(&destString, &srcString)\' failed",0
                      ,0);
  }
  uStack_80 = 0x12c021;
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x42c);
  if (destString.capacity == 8) {
    uStack_80 = 0x12c041;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x42d);
    if (destString.buffer == (char *)0x0) {
      ppcVar7 = &local_88;
      pcVar5 = "Assertion \'_ck_x != NULL\' failed";
      pcVar4 = "Assertion \'%s\' failed: %s == %#x";
      pcVar8 = "(void*) (destString).buffer != NULL";
      pcVar9 = "(void*) (destString).buffer";
      iVar2 = 0x42d;
LAB_0012c3f9:
      uStack_80 = 0;
      local_88 = (char *)0x0;
      *(code **)((long)ppcVar7 + -8) = test_AString_appendAString_failure_bufferExpansionFailed_fn;
      _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                        ,iVar2,pcVar5,pcVar4,pcVar8,pcVar9);
    }
    uStack_80 = 0x12c05e;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x42d);
    pcVar9 = destString.buffer;
    if (destString.buffer == (char *)0x0) {
      pcVar4 = "";
      pcVar9 = "(null)";
    }
    else {
      uStack_80 = 0x12c07b;
      iVar2 = strcmp("01234",destString.buffer);
      if (iVar2 == 0) {
        uStack_80 = 0x12c094;
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,0x42d);
        if (destString.size == 5) {
          uStack_80 = 0x12c0b4;
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x42d);
          if (srcString.capacity == 8) {
            uStack_80 = 0x12c0d4;
            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                        ,0x42e);
            if (srcString.buffer == (char *)0x0) {
              ppcVar7 = &local_88;
              pcVar5 = "Assertion \'_ck_x != NULL\' failed";
              pcVar4 = "Assertion \'%s\' failed: %s == %#x";
              pcVar8 = "(void*) (srcString).buffer != NULL";
              pcVar9 = "(void*) (srcString).buffer";
            }
            else {
              uStack_80 = 0x12c0f1;
              _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                          ,0x42e);
              if (srcString.buffer == (char *)0x0) {
                pcStack_b0 = "(null)";
                pcStack_a8 = "";
LAB_0012c323:
                uStack_80 = 0;
                local_88 = "\"";
                local_90 = "";
                local_98 = "\"";
                pcStack_a0 = "(\"\")";
                _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                  ,0x42e,
                                  "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
                                  ,"Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s",
                                  "(srcString).buffer == (\"\")","(srcString).buffer",pcStack_a8);
              }
              if (*srcString.buffer != '\0') {
                pcStack_a8 = "\"";
                pcStack_b0 = srcString.buffer;
                goto LAB_0012c323;
              }
              uStack_80 = 0x12c121;
              _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                          ,0x42e);
              if (srcString.size == 0) {
                uStack_80 = 0x12c140;
                _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                            ,0x42e);
                if (private_ACUtilsTest_AString_reallocCount == 0) {
                  uStack_80 = 0x12c161;
                  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                              ,0x42f);
                  uStack_80 = 0x12c16a;
                  (*destString.deallocator)(destString.buffer);
                  uStack_80 = 0x12c173;
                  (*srcString.deallocator)(srcString.buffer);
                  return;
                }
                ppcVar7 = &local_98;
                local_90 = "(0)";
                local_98 = (char *)private_ACUtilsTest_AString_reallocCount;
                pcVar5 = "Assertion \'_ck_x == _ck_y\' failed";
                pcVar4 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
                pcVar8 = "private_ACUtilsTest_AString_reallocCount == (0)";
                pcVar9 = "private_ACUtilsTest_AString_reallocCount";
                iVar2 = 0x42f;
                goto LAB_0012c3f9;
              }
              ppcVar7 = &local_98;
              local_90 = "strlen(\"\")";
              local_98 = (char *)srcString.size;
              pcVar5 = "Assertion \'_ck_x == _ck_y\' failed";
              pcVar4 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
              pcVar8 = "(srcString).size == strlen(\"\")";
              pcVar9 = "(srcString).size";
            }
            iVar2 = 0x42e;
            goto LAB_0012c3f9;
          }
          pcVar5 = "(srcString).capacity == (8)";
          pcVar8 = "(srcString).capacity";
          iVar2 = 0x42e;
          pcVar4 = (char *)srcString.capacity;
          goto LAB_0012c2ce;
        }
        local_90 = "strlen(\"01234\")";
        pcVar5 = "(destString).size == strlen(\"01234\")";
        pcVar8 = "(destString).size";
        iVar2 = 0x42d;
        local_88 = (char *)0x5;
        pcVar4 = (char *)destString.size;
        goto LAB_0012c2d4;
      }
      pcVar4 = "\"";
    }
    expr = 
    "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
    ;
    pcVar3 = "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s";
    pcVar5 = "(destString).buffer == (\"01234\")";
    pcVar8 = "(destString).buffer";
    iVar2 = 0x42d;
    local_88 = "\"";
    local_90 = "01234";
    local_98 = "\"";
    pcStack_a0 = "(\"01234\")";
    ppcVar6 = &pcStack_b0;
    pcStack_b0 = pcVar9;
    pcStack_a8 = pcVar4;
  }
  else {
    pcVar5 = "(destString).capacity == (8)";
    pcVar8 = "(destString).capacity";
    iVar2 = 0x42d;
    pcVar4 = (char *)destString.capacity;
LAB_0012c2ce:
    local_90 = "(8)";
    local_88 = (char *)0x8;
LAB_0012c2d4:
    expr = "Assertion \'_ck_x == _ck_y\' failed";
    pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
    ppcVar6 = &local_90;
  }
  uStack_80 = 0;
  *(char **)((long)ppcVar6 + -8) = pcVar4;
  *(undefined8 *)((long)ppcVar6 + -0x10) = 0x12c2dd;
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,iVar2,expr,pcVar3,pcVar5,pcVar8);
}

Assistant:

static struct AString private_ACUtilsTest_AString_constructTestString(const char *initBuffer, size_t capacity)
{
    bool tmp = private_ACUtilsTest_AString_reallocFail;
    struct AString string = {private_ACUtilsTest_AString_realloc, private_ACUtilsTest_AString_free};
    string.size = strlen(initBuffer);
    string.capacity = capacity;
    private_ACUtilsTest_AString_reallocFail = false;
    string.buffer = (char*) string.reallocator(nullptr, string.capacity + 1);
    private_ACUtilsTest_AString_reallocFail = tmp;
    private_ACUtilsTest_AString_reallocCount = 0;
    private_ACUtilsTest_AString_freeCount = 0;
    memcpy(string.buffer, initBuffer, string.size + 1); /* +1 for '\0' */
    return string;
}